

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O1

void __thiscall NaDynAr<char_*>::item::~item(item *this)

{
  if (this->pData == (char **)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
  }
  if (this->pData != (char **)0x0) {
    operator_delete(this->pData,8);
  }
  this->pData = (char **)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }